

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<unsigned_int>
kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser,ParserInput *input)

{
  ulong uVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  NullableValue<unsigned_int> in_RDI;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  
  pbVar5 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
  iVar4 = 0;
  pbVar6 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
  do {
    if (pbVar6 == (byte *)(input->super_IteratorInput<char,_const_char_*>).end) break;
    uVar7 = 1L << (*pbVar6 & 0x3f);
    uVar1 = (subParser->subParser).bits[*pbVar6 >> 6];
    pbVar2 = pbVar6 + ((uVar7 & uVar1) != 0);
    uVar7 = uVar7 & uVar1;
    pbVar3 = pbVar6;
    if (uVar7 != 0) {
      (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar2;
      iVar4 = iVar4 + 1;
      pbVar3 = pbVar2;
    }
    if (pbVar2 <= pbVar6) {
      pbVar2 = pbVar6;
    }
    if (pbVar5 < pbVar2) {
      pbVar5 = pbVar2;
    }
    (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar5;
    pbVar6 = pbVar3;
  } while (uVar7 != 0);
  *(undefined1 *)in_RDI = 1;
  *(int *)((long)in_RDI + 4) = iVar4;
  return (Maybe<unsigned_int>)in_RDI;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }